

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_args.cc
# Opt level: O3

string * spoof_hex_encoded_namespaces(string *__return_storage_ptr__,string *arg)

{
  pointer pcVar1;
  ostream *poVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  ulong uVar6;
  char *p;
  string substr;
  char *local_58;
  char *local_50;
  long local_48;
  char local_40 [16];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar4 = 0;
  cVar5 = (char)__return_storage_ptr__;
  if (3 < (int)arg->_M_string_length) {
    do {
      iVar3 = (int)uVar4;
      pcVar1 = (arg->_M_dataplus)._M_p;
      uVar6 = (long)iVar3 + 1;
      if ((pcVar1[iVar3] == '\\') && (pcVar1[uVar6] == 'x')) {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)arg);
        strtoul(local_50,&local_58,0x10);
        if (*local_58 == '\0') {
          std::__cxx11::string::push_back(cVar5);
          uVar6 = (ulong)(iVar3 + 4);
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Possibly malformed hex representation of a namespace: \'\\x",0x39);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_50,local_48);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\'\n",2);
          std::__cxx11::string::push_back(cVar5);
        }
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
      }
      else {
        std::__cxx11::string::push_back(cVar5);
      }
      uVar4 = uVar6 & 0xffffffff;
    } while ((int)uVar6 < (int)arg->_M_string_length + -3);
    uVar4 = (ulong)(int)uVar6;
  }
  for (; (long)uVar4 < (long)(int)arg->_M_string_length; uVar4 = uVar4 + 1) {
    std::__cxx11::string::push_back(cVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

string spoof_hex_encoded_namespaces(const string& arg)
{
  string res;
  int pos = 0;
  while (pos < (int)arg.size() - 3)
  {
    if (arg[pos] == '\\' && arg[pos + 1] == 'x')
    {
      string substr = arg.substr(pos + 2, 2);
      char* p;
      unsigned char c = (unsigned char)strtoul(substr.c_str(), &p, 16);
      if (*p == '\0')
      {
        res.push_back(c);
        pos += 4;
      }
      else
      {
        cerr << "Possibly malformed hex representation of a namespace: '\\x" << substr << "'\n";
        res.push_back(arg[pos++]);
      }
    }
    else
      res.push_back(arg[pos++]);
  }

  while (pos < (int)arg.size())  // copy last 2 characters
    res.push_back(arg[pos++]);

  return res;
}